

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3VdbeHalt(Vdbe *p)

{
  byte *pbVar1;
  char cVar2;
  sqlite3 *db;
  VdbeFrame *pVVar3;
  VTable **ppVVar4;
  sqlite3_vtab *pVtab;
  _func_int_sqlite3_vtab_ptr *p_Var5;
  Btree *pBVar6;
  Pager *pPager;
  sqlite3_vfs *pVfs;
  long lVar7;
  char *z;
  bool bVar8;
  bool bVar9;
  sqlite3_file *pFile;
  byte bVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  VdbeFrame *pFrame;
  char *pcVar15;
  char *zFile;
  uint uVar16;
  long lVar17;
  int iVar18;
  long lVar19;
  VdbeFrame *pDel;
  long in_FS_OFFSET;
  long local_58;
  uint local_48;
  int res;
  sqlite3_file *pSuperJrnl;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  db = p->db;
  if (db->mallocFailed != '\0') {
    p->rc = 7;
  }
  pVVar3 = p->pFrame;
  if (p->pFrame != (VdbeFrame *)0x0) {
    do {
      pFrame = pVVar3;
      pVVar3 = pFrame->pParent;
    } while (pVVar3 != (VdbeFrame *)0x0);
    sqlite3VdbeFrameRestore(pFrame);
    p->pFrame = (VdbeFrame *)0x0;
    p->nFrame = 0;
  }
  closeCursorsInFrame(p);
  releaseMemArray(p->aMem,p->nMem);
  while (pVVar3 = p->pDelFrame, pVVar3 != (VdbeFrame *)0x0) {
    p->pDelFrame = pVVar3->pParent;
    iVar14 = pVVar3->nChildMem;
    for (lVar19 = 0; lVar19 < pVVar3->nChildCsr; lVar19 = lVar19 + 1) {
      if ((&pVVar3[1].v)[(long)iVar14 * 7 + lVar19] != (Vdbe *)0x0) {
        sqlite3VdbeFreeCursorNN(pVVar3->v,(VdbeCursor *)(&pVVar3[1].v)[(long)iVar14 * 7 + lVar19]);
      }
    }
    releaseMemArray((Mem *)(pVVar3 + 1),pVVar3->nChildMem);
    sqlite3VdbeDeleteAuxData(pVVar3->v->db,&pVVar3->pAuxData,-1,0);
    sqlite3DbFreeNN(pVVar3->v->db,pVVar3);
  }
  if (p->pAuxData != (AuxData *)0x0) {
    sqlite3VdbeDeleteAuxData(p->db,&p->pAuxData,-1,0);
  }
  if ((p->field_0xc8 & 0x80) != 0) {
    sqlite3VdbeEnter(p);
    uVar13 = p->rc;
    bVar8 = false;
    if (uVar13 == 0) {
LAB_0013cf6b:
      sqlite3VdbeCheckFk(p,0);
      bVar9 = true;
      iVar14 = 0;
    }
    else {
      bVar10 = (byte)uVar13;
      if ((bVar10 < 0xe) && ((0x2680U >> (uVar13 & 0x1f) & 1) != 0)) {
        bVar8 = true;
        iVar14 = 0;
        if ((bVar10 == 9 & (byte)((*(ushort *)&p->field_0xc8 & 0x40) >> 6)) == 0) {
          if (((bVar10 == 0xd) || ((uVar13 & 0xff) == 7)) &&
             ((*(ushort *)&p->field_0xc8 & 0x20) != 0)) {
            iVar14 = 2;
            bVar9 = false;
          }
          else {
            sqlite3RollbackAll(db,0x204);
            sqlite3CloseSavepoints(db);
            db->autoCommit = '\x01';
            p->nChange = 0;
            bVar8 = true;
            bVar9 = true;
            iVar14 = 0;
            if (p->rc == 0) goto LAB_0013cf6b;
          }
        }
        else {
          bVar9 = true;
        }
      }
      else {
        bVar9 = true;
        bVar8 = false;
        iVar14 = 0;
        if (p->errorAction == '\x03') goto LAB_0013cf6b;
      }
    }
    if (((db->nVTrans < 1) || (db->aVTrans != (VTable **)0x0)) &&
       ((db->autoCommit != '\0' && (db->nVdbeWrite == (uint)((p->field_0xc8 & 0x40) == 0))))) {
      if ((p->rc == 0) || (!bVar8 && p->errorAction == '\x03')) {
        iVar18 = 1;
        iVar11 = sqlite3VdbeCheckFk(p,1);
        if (iVar11 == 0) {
          if ((db->flags >> 0x21 & 1) == 0) {
            ppVVar4 = db->aVTrans;
            db->aVTrans = (VTable **)0x0;
            iVar11 = 0;
            for (lVar19 = 0; (iVar11 == 0 && (lVar19 < db->nVTrans)); lVar19 = lVar19 + 1) {
              pVtab = ppVVar4[lVar19]->pVtab;
              iVar11 = 0;
              if ((pVtab != (sqlite3_vtab *)0x0) &&
                 (p_Var5 = pVtab->pModule->xSync, p_Var5 != (_func_int_sqlite3_vtab_ptr *)0x0)) {
                iVar11 = (*p_Var5)(pVtab);
                sqlite3VtabImportErrmsg(p,pVtab);
              }
            }
            db->aVTrans = ppVVar4;
            lVar17 = 0;
            lVar19 = 0;
            bVar8 = false;
            iVar18 = 0;
LAB_0013d10f:
            if (iVar11 == 0) {
              if (lVar19 < db->nDb) goto code_r0x0013d125;
              if ((bVar8) && (db->xCommitCallback != (_func_int_void_ptr *)0x0)) {
                iVar12 = (*db->xCommitCallback)(db->pCommitArg);
                iVar11 = 0x213;
                if (iVar12 != 0) goto LAB_0013d5aa;
              }
              pcVar15 = sqlite3BtreeGetFilename(db->aDb->pBt);
              iVar11 = sqlite3Strlen30(pcVar15);
              if ((iVar11 == 0) || (iVar18 < 2)) {
                lVar19 = 8;
                iVar11 = 0;
                for (lVar17 = 0; (iVar11 == 0 && (lVar17 < db->nDb)); lVar17 = lVar17 + 1) {
                  pBVar6 = *(Btree **)((long)&db->aDb->zDbSName + lVar19);
                  if (pBVar6 == (Btree *)0x0) {
                    iVar11 = 0;
                  }
                  else {
                    iVar11 = sqlite3BtreeCommitPhaseOne(pBVar6,(char *)0x0);
                  }
                  lVar19 = lVar19 + 0x20;
                }
                lVar19 = 8;
                lVar17 = 0;
                while (iVar11 == 0) {
                  if (db->nDb <= lVar17) goto LAB_0013d773;
                  pBVar6 = *(Btree **)((long)&db->aDb->zDbSName + lVar19);
                  if (pBVar6 == (Btree *)0x0) {
                    iVar11 = 0;
                  }
                  else {
                    iVar11 = sqlite3BtreeCommitPhaseTwo(pBVar6,0);
                  }
                  lVar17 = lVar17 + 1;
                  lVar19 = lVar19 + 0x20;
                }
                goto LAB_0013d58b;
              }
              pVfs = db->pVfs;
              pSuperJrnl = (sqlite3_file *)0x0;
              res = -0x55555556;
              uVar13 = sqlite3Strlen30(pcVar15);
              pcVar15 = sqlite3MPrintf(db,"%.4c%s%.16c",0,pcVar15);
              if (pcVar15 != (char *)0x0) {
                zFile = pcVar15 + 4;
                uVar16 = 0;
                goto LAB_0013d260;
              }
              iVar11 = 7;
            }
            goto LAB_0013d58b;
          }
          db->flags = db->flags & 0xfffffffdffffffff;
          iVar11 = 0xb;
        }
        else {
          iVar11 = 0x313;
          if ((p->field_0xc8 & 0x40) != 0) {
            sqlite3VdbeLeave(p);
            goto LAB_0013d6cf;
          }
        }
        goto LAB_0013d5aa;
      }
      if ((p->rc != 0x11) || (db->nVdbeActive < 2)) {
        sqlite3RollbackAll(db,0);
      }
      p->nChange = 0;
      goto LAB_0013d5d1;
    }
    if (((bVar9) && (iVar14 = 1, p->rc != 0)) && (p->errorAction != '\x03')) {
      if (p->errorAction == '\x02') {
        iVar14 = 2;
        goto LAB_0013d5e0;
      }
      sqlite3RollbackAll(db,0x204);
      sqlite3CloseSavepoints(db);
      iVar18 = 0;
    }
    else {
LAB_0013d5e0:
      iVar18 = iVar14;
      if (((p->db->nStatement == 0) || (p->iStatement == 0)) ||
         (iVar14 = vdbeCloseStatement(p,iVar18), iVar14 == 0)) goto LAB_0013d64f;
      if (p->rc == 0 || (char)p->rc == '\x13') {
        p->rc = iVar14;
        sqlite3DbFree(db,p->zErrMsg);
        p->zErrMsg = (char *)0x0;
      }
      sqlite3RollbackAll(db,0x204);
      sqlite3CloseSavepoints(db);
    }
    db->autoCommit = '\x01';
    p->nChange = 0;
    goto LAB_0013d64f;
  }
  goto LAB_0013d67d;
code_r0x0013d4f5:
  pBVar6 = *(Btree **)((long)&db->aDb->zDbSName + lVar19);
  if (pBVar6 == (Btree *)0x0) {
    iVar11 = 0;
  }
  else {
    iVar11 = sqlite3BtreeCommitPhaseOne(pBVar6,zFile);
  }
  lVar17 = lVar17 + 1;
  lVar19 = lVar19 + 0x20;
  goto LAB_0013d4e3;
code_r0x0013d125:
  pBVar6 = *(Btree **)((long)&db->aDb->pBt + lVar17);
  iVar11 = 0;
  if ((pBVar6 != (Btree *)0x0) && (pBVar6->inTrans == '\x02')) {
    sqlite3BtreeEnter(pBVar6);
    pPager = pBVar6->pBt->pPager;
    if (((&db->aDb->safety_level)[lVar17] != '\x01') &&
       (((0x34UL >> ((ulong)pPager->journalMode & 0x3f) & 1) == 0 && (pPager->tempFile == '\0')))) {
      iVar18 = iVar18 + (uint)(pPager->memVfs == '\0');
    }
    iVar11 = sqlite3PagerExclusiveLock(pPager);
    sqlite3BtreeLeave(pBVar6);
    bVar8 = true;
  }
  lVar19 = lVar19 + 1;
  lVar17 = lVar17 + 0x20;
  goto LAB_0013d10f;
  while( true ) {
    sqlite3_randomness(4,&local_48);
    sqlite3_snprintf(0xd,pcVar15 + (ulong)uVar13 + 4,"-mj%06X9%02X",(ulong)(local_48 >> 8));
    iVar11 = (*pVfs->xAccess)(pVfs,zFile,0,&res);
    if ((iVar11 != 0) || (uVar16 = uVar16 + 1, res == 0)) break;
LAB_0013d260:
    local_48 = 0xaaaaaaaa;
    if (uVar16 != 0) {
      if (100 < uVar16) {
        sqlite3_log(0xd,"MJ delete: %s",zFile);
        if (pVfs->xDelete != (_func_int_sqlite3_vfs_ptr_char_ptr_int *)0x0) {
          (*pVfs->xDelete)(pVfs,zFile,0);
        }
        goto LAB_0013d3ad;
      }
      if (uVar16 == 1) {
        sqlite3_log(0xd,"MJ collide: %s",zFile);
      }
    }
  }
  if (iVar11 == 0) {
LAB_0013d3ad:
    iVar11 = sqlite3OsOpenMalloc(pVfs,zFile,&pSuperJrnl,0x4016,(int *)0x0);
    pFile = pSuperJrnl;
    if (iVar11 == 0) {
      local_58 = 0;
      lVar19 = 8;
      for (lVar17 = 0; lVar17 < db->nDb; lVar17 = lVar17 + 1) {
        lVar7 = *(long *)((long)&db->aDb->zDbSName + lVar19);
        if (((lVar7 != 0) && (*(char *)(lVar7 + 0x10) == '\x02')) &&
           (z = *(char **)(**(long **)(lVar7 + 8) + 0xe0), z != (char *)0x0)) {
          iVar18 = sqlite3Strlen30(z);
          iVar11 = (*pFile->pMethods->xWrite)(pFile,z,iVar18 + 1,local_58);
          uVar13 = sqlite3Strlen30(z);
          if (iVar11 != 0) {
            sqlite3OsCloseFree(pFile);
            if (pVfs->xDelete != (_func_int_sqlite3_vfs_ptr_char_ptr_int *)0x0) {
              (*pVfs->xDelete)(pVfs,zFile,0);
            }
            goto LAB_0013d580;
          }
          local_58 = local_58 + (ulong)uVar13 + 1;
        }
        lVar19 = lVar19 + 0x20;
      }
      uVar13 = (*pFile->pMethods->xDeviceCharacteristics)(pFile);
      if (((uVar13 >> 10 & 1) == 0) && (iVar11 = (*pFile->pMethods->xSync)(pFile,2), iVar11 != 0)) {
        sqlite3OsCloseFree(pFile);
        if (pVfs->xDelete != (_func_int_sqlite3_vfs_ptr_char_ptr_int *)0x0) {
          (*pVfs->xDelete)(pVfs,zFile,0);
        }
      }
      else {
        lVar17 = 0;
        lVar19 = 8;
        iVar11 = 0;
LAB_0013d4e3:
        if (iVar11 == 0) {
          if (lVar17 < db->nDb) goto code_r0x0013d4f5;
          sqlite3OsCloseFree(pFile);
          if (pVfs->xDelete == (_func_int_sqlite3_vfs_ptr_char_ptr_int *)0x0) {
            iVar11 = 0;
          }
          else {
            iVar11 = (*pVfs->xDelete)(pVfs,zFile,1);
          }
          sqlite3DbFreeNN(db,pcVar15);
          if (iVar11 == 0) {
            if (sqlite3Hooks_0 != (code *)0x0) {
              (*sqlite3Hooks_0)();
            }
            lVar19 = 8;
            for (lVar17 = 0; lVar17 < db->nDb; lVar17 = lVar17 + 1) {
              pBVar6 = *(Btree **)((long)&db->aDb->zDbSName + lVar19);
              if (pBVar6 != (Btree *)0x0) {
                sqlite3BtreeCommitPhaseTwo(pBVar6,1);
              }
              lVar19 = lVar19 + 0x20;
            }
            if (sqlite3Hooks_1 != (code *)0x0) {
              (*sqlite3Hooks_1)();
            }
LAB_0013d773:
            sqlite3VtabCommit(db);
            db->nDeferredCons = 0;
            db->nDeferredImmCons = 0;
            pbVar1 = (byte *)((long)&db->flags + 2);
            *pbVar1 = *pbVar1 & 0xf7;
            *(byte *)&db->mDbFlags = (byte)db->mDbFlags & 0xfe;
            goto LAB_0013d5d1;
          }
          goto LAB_0013d58b;
        }
        sqlite3OsCloseFree(pFile);
      }
    }
  }
LAB_0013d580:
  sqlite3DbFreeNN(db,pcVar15);
LAB_0013d58b:
  if (iVar11 == 5) {
    if ((p->field_0xc8 & 0x40) != 0) {
      sqlite3VdbeLeave(p);
      iVar18 = 5;
      goto LAB_0013d6cf;
    }
    iVar11 = 5;
  }
LAB_0013d5aa:
  sqlite3SystemError(db,iVar11);
  p->rc = iVar11;
  sqlite3RollbackAll(db,0);
  p->nChange = 0;
LAB_0013d5d1:
  db->nStatement = 0;
  iVar18 = 0;
  if (!bVar9) goto LAB_0013d5e0;
LAB_0013d64f:
  if ((p->field_0xc8 & 0x10) != 0) {
    if (iVar18 == 2) {
      lVar19 = 0;
    }
    else {
      lVar19 = p->nChange;
      db->nTotalChange = db->nTotalChange + lVar19;
    }
    db->nChange = lVar19;
    p->nChange = 0;
  }
  sqlite3VdbeLeave(p);
LAB_0013d67d:
  db->nVdbeActive = db->nVdbeActive + -1;
  cVar2 = (char)*(ushort *)&p->field_0xc8;
  if ((*(ushort *)&p->field_0xc8 & 0x40) == 0) {
    db->nVdbeWrite = db->nVdbeWrite + -1;
    cVar2 = (char)*(undefined2 *)&p->field_0xc8;
  }
  if (cVar2 < '\0') {
    db->nVdbeRead = db->nVdbeRead + -1;
  }
  p->eVdbeState = '\x03';
  if (db->mallocFailed == '\0') {
    iVar18 = (uint)(p->rc == 5) * 5;
  }
  else {
    p->rc = 7;
    iVar18 = 0;
  }
LAB_0013d6cf:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar18;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeHalt(Vdbe *p){
  int rc;                         /* Used to store transient return codes */
  sqlite3 *db = p->db;

  /* This function contains the logic that determines if a statement or
  ** transaction will be committed or rolled back as a result of the
  ** execution of this virtual machine.
  **
  ** If any of the following errors occur:
  **
  **     SQLITE_NOMEM
  **     SQLITE_IOERR
  **     SQLITE_FULL
  **     SQLITE_INTERRUPT
  **
  ** Then the internal cache might have been left in an inconsistent
  ** state.  We need to rollback the statement transaction, if there is
  ** one, or the complete transaction if there is no statement transaction.
  */

  assert( p->eVdbeState==VDBE_RUN_STATE );
  if( db->mallocFailed ){
    p->rc = SQLITE_NOMEM_BKPT;
  }
  closeAllCursors(p);
  checkActiveVdbeCnt(db);

  /* No commit or rollback needed if the program never started or if the
  ** SQL statement does not read or write a database file.  */
  if( p->bIsReader ){
    int mrc;   /* Primary error code from p->rc */
    int eStatementOp = 0;
    int isSpecialError;            /* Set to true if a 'special' error */

    /* Lock all btrees used by the statement */
    sqlite3VdbeEnter(p);

    /* Check for one of the special errors */
    if( p->rc ){
      mrc = p->rc & 0xff;
      isSpecialError = mrc==SQLITE_NOMEM
                    || mrc==SQLITE_IOERR
                    || mrc==SQLITE_INTERRUPT
                    || mrc==SQLITE_FULL;
    }else{
      mrc = isSpecialError = 0;
    }
    if( isSpecialError ){
      /* If the query was read-only and the error code is SQLITE_INTERRUPT,
      ** no rollback is necessary. Otherwise, at least a savepoint
      ** transaction must be rolled back to restore the database to a
      ** consistent state.
      **
      ** Even if the statement is read-only, it is important to perform
      ** a statement or transaction rollback operation. If the error
      ** occurred while writing to the journal, sub-journal or database
      ** file as part of an effort to free up cache space (see function
      ** pagerStress() in pager.c), the rollback is required to restore
      ** the pager to a consistent state.
      */
      if( !p->readOnly || mrc!=SQLITE_INTERRUPT ){
        if( (mrc==SQLITE_NOMEM || mrc==SQLITE_FULL) && p->usesStmtJournal ){
          eStatementOp = SAVEPOINT_ROLLBACK;
        }else{
          /* We are forced to roll back the active transaction. Before doing
          ** so, abort any other statements this handle currently has active.
          */
          sqlite3RollbackAll(db, SQLITE_ABORT_ROLLBACK);
          sqlite3CloseSavepoints(db);
          db->autoCommit = 1;
          p->nChange = 0;
        }
      }
    }

    /* Check for immediate foreign key violations. */
    if( p->rc==SQLITE_OK || (p->errorAction==OE_Fail && !isSpecialError) ){
      (void)sqlite3VdbeCheckFk(p, 0);
    }

    /* If the auto-commit flag is set and this is the only active writer
    ** VM, then we do either a commit or rollback of the current transaction.
    **
    ** Note: This block also runs if one of the special errors handled
    ** above has occurred.
    */
    if( !sqlite3VtabInSync(db)
     && db->autoCommit
     && db->nVdbeWrite==(p->readOnly==0)
    ){
      if( p->rc==SQLITE_OK || (p->errorAction==OE_Fail && !isSpecialError) ){
        rc = sqlite3VdbeCheckFk(p, 1);
        if( rc!=SQLITE_OK ){
          if( NEVER(p->readOnly) ){
            sqlite3VdbeLeave(p);
            return SQLITE_ERROR;
          }
          rc = SQLITE_CONSTRAINT_FOREIGNKEY;
        }else if( db->flags & SQLITE_CorruptRdOnly ){
          rc = SQLITE_CORRUPT;
          db->flags &= ~SQLITE_CorruptRdOnly;
        }else{
          /* The auto-commit flag is true, the vdbe program was successful
          ** or hit an 'OR FAIL' constraint and there are no deferred foreign
          ** key constraints to hold up the transaction. This means a commit
          ** is required. */
          rc = vdbeCommit(db, p);
        }
        if( rc==SQLITE_BUSY && p->readOnly ){
          sqlite3VdbeLeave(p);
          return SQLITE_BUSY;
        }else if( rc!=SQLITE_OK ){
          sqlite3SystemError(db, rc);
          p->rc = rc;
          sqlite3RollbackAll(db, SQLITE_OK);
          p->nChange = 0;
        }else{
          db->nDeferredCons = 0;
          db->nDeferredImmCons = 0;
          db->flags &= ~(u64)SQLITE_DeferFKs;
          sqlite3CommitInternalChanges(db);
        }
      }else if( p->rc==SQLITE_SCHEMA && db->nVdbeActive>1 ){
        p->nChange = 0;
      }else{
        sqlite3RollbackAll(db, SQLITE_OK);
        p->nChange = 0;
      }
      db->nStatement = 0;
    }else if( eStatementOp==0 ){
      if( p->rc==SQLITE_OK || p->errorAction==OE_Fail ){
        eStatementOp = SAVEPOINT_RELEASE;
      }else if( p->errorAction==OE_Abort ){
        eStatementOp = SAVEPOINT_ROLLBACK;
      }else{
        sqlite3RollbackAll(db, SQLITE_ABORT_ROLLBACK);
        sqlite3CloseSavepoints(db);
        db->autoCommit = 1;
        p->nChange = 0;
      }
    }

    /* If eStatementOp is non-zero, then a statement transaction needs to
    ** be committed or rolled back. Call sqlite3VdbeCloseStatement() to
    ** do so. If this operation returns an error, and the current statement
    ** error code is SQLITE_OK or SQLITE_CONSTRAINT, then promote the
    ** current statement error code.
    */
    if( eStatementOp ){
      rc = sqlite3VdbeCloseStatement(p, eStatementOp);
      if( rc ){
        if( p->rc==SQLITE_OK || (p->rc&0xff)==SQLITE_CONSTRAINT ){
          p->rc = rc;
          sqlite3DbFree(db, p->zErrMsg);
          p->zErrMsg = 0;
        }
        sqlite3RollbackAll(db, SQLITE_ABORT_ROLLBACK);
        sqlite3CloseSavepoints(db);
        db->autoCommit = 1;
        p->nChange = 0;
      }
    }

    /* If this was an INSERT, UPDATE or DELETE and no statement transaction
    ** has been rolled back, update the database connection change-counter.
    */
    if( p->changeCntOn ){
      if( eStatementOp!=SAVEPOINT_ROLLBACK ){
        sqlite3VdbeSetChanges(db, p->nChange);
      }else{
        sqlite3VdbeSetChanges(db, 0);
      }
      p->nChange = 0;
    }

    /* Release the locks */
    sqlite3VdbeLeave(p);
  }

  /* We have successfully halted and closed the VM.  Record this fact. */
  db->nVdbeActive--;
  if( !p->readOnly ) db->nVdbeWrite--;
  if( p->bIsReader ) db->nVdbeRead--;
  assert( db->nVdbeActive>=db->nVdbeRead );
  assert( db->nVdbeRead>=db->nVdbeWrite );
  assert( db->nVdbeWrite>=0 );
  p->eVdbeState = VDBE_HALT_STATE;
  checkActiveVdbeCnt(db);
  if( db->mallocFailed ){
    p->rc = SQLITE_NOMEM_BKPT;
  }

  /* If the auto-commit flag is set to true, then any locks that were held
  ** by connection db have now been released. Call sqlite3ConnectionUnlocked()
  ** to invoke any required unlock-notify callbacks.
  */
  if( db->autoCommit ){
    sqlite3ConnectionUnlocked(db);
  }

  assert( db->nVdbeActive>0 || db->autoCommit==0 || db->nStatement==0 );
  return (p->rc==SQLITE_BUSY ? SQLITE_BUSY : SQLITE_OK);
}